

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_attrs(lyd_node *first,lyd_node *second,uint16_t options,lyd_diff_op *op,
                     char **orig_default,char **orig_value)

{
  uint16_t uVar1;
  ushort uVar2;
  lysc_node *plVar3;
  bool bVar4;
  LY_ERR LVar5;
  lyd_diff_op lVar6;
  lyd_node *plVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  
  if (first == (lyd_node *)0x0 && second == (lyd_node *)0x0) {
    __assert_fail("first || second",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2f7,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  *orig_default = (char *)0x0;
  *orig_value = (char *)0x0;
  plVar7 = second;
  if (first != (lyd_node *)0x0) {
    plVar7 = first;
  }
  plVar3 = plVar7->schema;
  if (((plVar3 != (lysc_node *)0x0) && ((plVar3->nodetype & 0x18) != 0)) &&
     ((plVar3->flags & 0x40) != 0)) {
    __assert_fail("!lysc_is_userordered(schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2fd,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  bVar10 = second == (lyd_node *)0x0;
  bVar4 = true;
  if (first == (lyd_node *)0x0 || bVar10) {
    lVar6 = (lyd_diff_op)bVar10;
    goto LAB_00119fa0;
  }
  uVar1 = plVar3->nodetype;
  if (uVar1 == 1) {
    return LY_ENOT;
  }
  if (uVar1 == 4) {
LAB_0011a04a:
    LVar5 = lyd_compare_single(first,second,0);
    if (LVar5 != LY_SUCCESS) {
      lVar6 = LYD_DIFF_OP_REPLACE;
      bVar4 = false;
      goto LAB_00119fa0;
    }
  }
  else if (uVar1 != 8) {
    if (uVar1 == 0x400) {
      return LY_ENOT;
    }
    if ((uVar1 == 0x20) || (uVar1 == 0x60)) goto LAB_0011a04a;
    if (uVar1 == 0x100) {
      return LY_ENOT;
    }
    if (uVar1 == 0x200) {
      return LY_ENOT;
    }
    if (uVar1 != 0x10) {
      ly_log(plVar3->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x325);
      return LY_EINT;
    }
  }
  if ((options & 1) == 0) {
    return LY_ENOT;
  }
  bVar4 = true;
  if (((second->flags ^ first->flags) & 1) == 0) {
    return LY_ENOT;
  }
  lVar6 = LYD_DIFF_OP_NONE;
LAB_00119fa0:
  *op = lVar6;
  uVar2 = plVar3->nodetype;
  if ((first != (lyd_node *)0x0 && !bVar10) && (uVar2 & 0xc) != 0) {
    pcVar9 = "true";
    if ((first->flags & 1) == 0) {
      pcVar9 = "false";
    }
    *orig_default = pcVar9;
  }
  if ((uVar2 & 100) != 0 && !bVar4) {
    if (uVar2 == 4) {
      pcVar8 = lyd_get_value(first);
      pcVar9 = "";
      if (pcVar8 != (char *)0x0) {
        pcVar9 = pcVar8;
      }
      pcVar9 = strdup(pcVar9);
      *orig_value = pcVar9;
      if (pcVar9 == (char *)0x0) {
        ly_log(plVar3->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_diff_attrs");
        return LY_EMEM;
      }
    }
    else {
      LVar5 = lyd_any_value_str(first,orig_value);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_diff_attrs(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, enum lyd_diff_op *op,
        const char **orig_default, char **orig_value)
{
    const struct lysc_node *schema;
    const char *str_val;

    assert(first || second);

    *orig_default = NULL;
    *orig_value = NULL;

    schema = first ? first->schema : second->schema;
    assert(!lysc_is_userordered(schema));

    /* learn operation first */
    if (!second) {
        *op = LYD_DIFF_OP_DELETE;
    } else if (!first) {
        *op = LYD_DIFF_OP_CREATE;
    } else {
        switch (schema->nodetype) {
        case LYS_CONTAINER:
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
            /* no changes */
            return LY_ENOT;
        case LYS_LIST:
        case LYS_LEAFLIST:
            if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        case LYS_LEAF:
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (lyd_compare_single(first, second, 0)) {
                /* different values */
                *op = LYD_DIFF_OP_REPLACE;
            } else if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        default:
            LOGINT_RET(schema->module->ctx);
        }
    }

    /*
     * set each attribute correctly based on the operation and node type
     */

    /* orig-default */
    if ((schema->nodetype & LYD_NODE_TERM) && ((*op == LYD_DIFF_OP_REPLACE) || (*op == LYD_DIFF_OP_NONE))) {
        if (first->flags & LYD_DEFAULT) {
            *orig_default = "true";
        } else {
            *orig_default = "false";
        }
    }

    /* orig-value */
    if ((schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && (*op == LYD_DIFF_OP_REPLACE)) {
        if (schema->nodetype == LYS_LEAF) {
            str_val = lyd_get_value(first);
            *orig_value = strdup(str_val ? str_val : "");
            LY_CHECK_ERR_RET(!*orig_value, LOGMEM(schema->module->ctx), LY_EMEM);
        } else {
            LY_CHECK_RET(lyd_any_value_str(first, orig_value));
        }
    }

    return LY_SUCCESS;
}